

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateInterface
          (ServiceGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->vars_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "class $dllexport_decl $$classname$ : public ::$proto_ns$::Service {\n protected:\n  // This class should be treated as an abstract interface.\n  inline $classname$() {};\n public:\n  virtual ~$classname$();\n"
            );
  io::Printer::Indent((Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "\ntypedef $classname$_Stub Stub;\n\nstatic const ::$proto_ns$::ServiceDescriptor* descriptor();\n\n"
            );
  GenerateMethodSignatures
            (this,VIRTUAL,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "\n// implements Service ----------------------------------------------\n\nconst ::$proto_ns$::ServiceDescriptor* GetDescriptor();\nvoid CallMethod(const ::$proto_ns$::MethodDescriptor* method,\n                ::$proto_ns$::RpcController* controller,\n                const ::$proto_ns$::Message* request,\n                ::$proto_ns$::Message* response,\n                ::google::protobuf::Closure* done);\nconst ::$proto_ns$::Message& GetRequestPrototype(\n  const ::$proto_ns$::MethodDescriptor* method) const;\nconst ::$proto_ns$::Message& GetResponsePrototype(\n  const ::$proto_ns$::MethodDescriptor* method) const;\n"
            );
  io::Printer::Outdent((Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "\n private:\n  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n};\n\n");
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void ServiceGenerator::GenerateInterface(io::Printer* printer) {
  Formatter format(printer, vars_);
  format(
      "class $dllexport_decl $$classname$ : public ::$proto_ns$::Service {\n"
      " protected:\n"
      "  // This class should be treated as an abstract interface.\n"
      "  inline $classname$() {};\n"
      " public:\n"
      "  virtual ~$classname$();\n");
  printer->Indent();

  format(
      "\n"
      "typedef $classname$_Stub Stub;\n"
      "\n"
      "static const ::$proto_ns$::ServiceDescriptor* descriptor();\n"
      "\n");

  GenerateMethodSignatures(VIRTUAL, printer);

  format(
      "\n"
      "// implements Service ----------------------------------------------\n"
      "\n"
      "const ::$proto_ns$::ServiceDescriptor* GetDescriptor();\n"
      "void CallMethod(const ::$proto_ns$::MethodDescriptor* method,\n"
      "                ::$proto_ns$::RpcController* controller,\n"
      "                const ::$proto_ns$::Message* request,\n"
      "                ::$proto_ns$::Message* response,\n"
      "                ::google::protobuf::Closure* done);\n"
      "const ::$proto_ns$::Message& GetRequestPrototype(\n"
      "  const ::$proto_ns$::MethodDescriptor* method) const;\n"
      "const ::$proto_ns$::Message& GetResponsePrototype(\n"
      "  const ::$proto_ns$::MethodDescriptor* method) const;\n");

  printer->Outdent();
  format(
      "\n"
      " private:\n"
      "  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n"
      "};\n"
      "\n");
}